

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void __thiscall Assimp::LWOImporter::LoadLWOPoints(LWOImporter *this,uint length)

{
  Layer *this_00;
  DeadlyImportError *this_01;
  uint uVar1;
  ulong uVar2;
  allocator<char> local_41;
  string local_40;
  
  if (length % 0xc == 0) {
    this_00 = this->mCurLayer;
    uVar1 = length / 0xc +
            (int)(((long)(this_00->mTempPoints).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this_00->mTempPoints).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0xc);
    if (this->mIsLWO2 == true) {
      uVar2 = (ulong)((uVar1 >> 2) + uVar1);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                (&this_00->mTempPoints,uVar2);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                (&this->mCurLayer->mTempPoints,(ulong)uVar1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (&this->mCurLayer->mPointReferrers,uVar2);
      local_40._M_dataplus._M_p._0_4_ = 0xffffffff;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->mCurLayer->mPointReferrers,(ulong)uVar1,(value_type_conflict1 *)&local_40);
    }
    else {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                (&this_00->mTempPoints,(ulong)uVar1);
    }
    for (uVar2 = 0; (length & 0xfffffffc) != uVar2; uVar2 = uVar2 + 4) {
      ByteSwap::Swap4(this->mFileBuffer + uVar2);
    }
    memcpy((this->mCurLayer->mTempPoints).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start,this->mFileBuffer,(ulong)length);
    return;
  }
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"LWO2: Points chunk length is not multiple of vertexLen (12)",
             &local_41);
  DeadlyImportError::DeadlyImportError(this_01,&local_40);
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LWOImporter::LoadLWOPoints(unsigned int length)
{
    // --- this function is used for both LWO2 and LWOB but for
    // LWO2 we need to allocate 25% more storage - it could be we'll
    // need to duplicate some points later.
    const size_t vertexLen = 12;
    if ((length % vertexLen) != 0)
    {
        throw DeadlyImportError( "LWO2: Points chunk length is not multiple of vertexLen (12)");
    }
    unsigned int regularSize = (unsigned int)mCurLayer->mTempPoints.size() + length / 12;
    if (mIsLWO2)
    {
        mCurLayer->mTempPoints.reserve  ( regularSize + (regularSize>>2u) );
        mCurLayer->mTempPoints.resize   ( regularSize );

        // initialize all point referrers with the default values
        mCurLayer->mPointReferrers.reserve  ( regularSize + (regularSize>>2u) );
        mCurLayer->mPointReferrers.resize   ( regularSize, UINT_MAX );
    }
    else mCurLayer->mTempPoints.resize( regularSize );

    // perform endianness conversions
#ifndef AI_BUILD_BIG_ENDIAN
    for (unsigned int i = 0; i < length>>2;++i)
        ByteSwap::Swap4( mFileBuffer + (i << 2));
#endif
    ::memcpy(&mCurLayer->mTempPoints[0],mFileBuffer,length);
}